

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cpp
# Opt level: O1

void __thiscall
arangodb::velocypack::Validator::validateArray(Validator *this,uint8_t *ptr,size_t length)

{
  uint8_t uVar1;
  uint uVar2;
  ValueLength VVar3;
  ulong uVar4;
  ulong *puVar5;
  Validator *pVVar6;
  Validator *pVVar7;
  ulong uVar8;
  Exception *pEVar9;
  byte bVar10;
  Validator *pVVar11;
  Validator *pVVar12;
  ulong uVar13;
  char *pcVar14;
  ulong uVar15;
  Validator *pVVar16;
  size_t length_00;
  long lVar17;
  ulong uVar18;
  Validator *pVStack_40;
  Validator *pVStack_38;
  
  uVar1 = *ptr;
  if (uVar1 == '\x13') {
    validateBufferLength(this,4,length,true);
    pVStack_40 = (Validator *)(ptr + 1);
    VVar3 = ReadVariableLengthValue<false>((uint8_t **)&pVStack_40,ptr + length + 1);
    pVVar16 = pVStack_40;
    if ((VVar3 <= length) && (3 < VVar3)) {
      pVStack_40 = (Validator *)(ptr + (VVar3 - 1));
      VVar3 = ReadVariableLengthValue<true>((uint8_t **)&pVStack_40,ptr + VVar3);
      if (VVar3 != 0) {
        pVVar6 = (Validator *)((long)&pVStack_40->options + 1);
        pVStack_40 = pVVar16;
        while (pVVar16 < pVVar6) {
          validatePart(this,(uint8_t *)pVVar16,(long)pVVar6 - (long)pVVar16,true);
          uVar4 = (ulong)"\x01\x01"[*(byte *)&pVVar16->options];
          pVStack_38 = pVVar16;
          if (uVar4 == 0) {
            uVar4 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
                    byteSizeDynamic((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
                                     *)&pVStack_38,(uint8_t *)pVVar16);
          }
          VVar3 = VVar3 - 1;
          pVVar16 = (Validator *)((long)&pVVar16->options + uVar4);
          if (VVar3 == 0) {
            return;
          }
        }
        pVStack_40 = pVVar16;
        pEVar9 = (Exception *)__cxa_allocate_exception(0x18);
        pcVar14 = "Array items number is out of bounds";
        goto LAB_0010403e;
      }
    }
    pEVar9 = (Exception *)__cxa_allocate_exception(0x18);
    pcVar14 = "Array length value is out of bounds";
LAB_0010403e:
    Exception::Exception(pEVar9,ValidatorInvalidLength,pcVar14);
    __cxa_throw(pEVar9,&Exception::typeinfo,Exception::~Exception);
  }
  if ((byte)(uVar1 - 2) < 4) {
    uVar1 = *ptr;
    lVar17 = 1L << (uVar1 - 2 & 0x3f);
    pVStack_38 = this;
    validateBufferLength(this,lVar17 + 2,length,true);
    if (lVar17 - 1U < 8) {
      switch(uVar1) {
      case '\x02':
        uVar4 = (ulong)ptr[1];
        break;
      case '\x03':
        uVar4 = (ulong)*(ushort *)(ptr + 1);
        break;
      case '\x04':
        uVar4 = (ulong)*(uint *)(ptr + 1);
        break;
      case '\x05':
        uVar4 = *(ulong *)(ptr + 1);
      }
    }
    else {
      uVar4 = 0;
    }
    if (length < uVar4) {
      pEVar9 = (Exception *)__cxa_allocate_exception(0x18);
      pcVar14 = "Array length is out of bounds";
    }
    else {
      uVar18 = lVar17 + 1;
      uVar15 = 9;
      if ((long)uVar4 < 9) {
        uVar15 = uVar4;
      }
      if ((long)uVar18 < (long)uVar15) {
        pVVar16 = (Validator *)(ptr + uVar15);
        uVar8 = uVar18;
        do {
          if (ptr[uVar8] != '\0') {
            pVVar16 = (Validator *)(ptr + uVar8);
            uVar15 = uVar8;
            break;
          }
          uVar8 = uVar8 + 1;
        } while (uVar15 != uVar8);
      }
      else {
        pVVar16 = (Validator *)(ptr + lVar17 + 1);
        uVar15 = uVar18;
      }
      uVar8 = uVar4 - uVar15;
      if (uVar8 == 0 || (long)uVar4 < (long)uVar15) {
        pEVar9 = (Exception *)__cxa_allocate_exception(0x18);
        pcVar14 = "Array structure is invalid";
      }
      else if (uVar15 == 9 || uVar15 == uVar18) {
        validatePart(pVStack_38,(uint8_t *)pVVar16,length - uVar15,true);
        VVar3 = (ValueLength)"\x01\x01"[*(byte *)&pVVar16->options];
        pVStack_40 = pVVar16;
        if (VVar3 == 0) {
          VVar3 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
                  byteSizeDynamic((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
                                   *)&pVStack_40,(uint8_t *)pVVar16);
        }
        if (VVar3 == 0) {
          pEVar9 = (Exception *)__cxa_allocate_exception(0x18);
          pcVar14 = "Array itemSize value is invalid";
        }
        else if (uVar8 < VVar3) {
          pEVar9 = (Exception *)__cxa_allocate_exception(0x18);
          pcVar14 = "Array nrItems value is invalid";
        }
        else {
          uVar8 = uVar8 / VVar3;
          pVVar16 = (Validator *)((long)&pVVar16->options + VVar3);
          length_00 = (long)(ptr + length) - (long)pVVar16;
          do {
            uVar8 = uVar8 - 1;
            if (uVar8 == 0) {
              return;
            }
            if ((Validator *)(ptr + length) <= pVVar16) {
              pEVar9 = (Exception *)__cxa_allocate_exception(0x18);
              pcVar14 = "Array value is out of bounds";
              goto LAB_00104289;
            }
            validatePart(pVStack_38,(uint8_t *)pVVar16,length_00,true);
            uVar4 = (ulong)"\x01\x01"[*(byte *)&pVVar16->options];
            pVStack_40 = pVVar16;
            if (uVar4 == 0) {
              uVar4 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
                      byteSizeDynamic((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
                                       *)&pVStack_40,(uint8_t *)pVVar16);
            }
            pVVar16 = (Validator *)((long)&pVVar16->options + VVar3);
            length_00 = length_00 - VVar3;
          } while (uVar4 == VVar3);
          pEVar9 = (Exception *)__cxa_allocate_exception(0x18);
          pcVar14 = "Unexpected Array value length";
        }
      }
      else {
        pEVar9 = (Exception *)__cxa_allocate_exception(0x18);
        pcVar14 = "Array padding is invalid";
      }
    }
LAB_00104289:
    Exception::Exception(pEVar9,ValidatorInvalidLength,pcVar14);
    __cxa_throw(pEVar9,&Exception::typeinfo,Exception::~Exception);
  }
  if (3 < (byte)(uVar1 - 6)) {
    return;
  }
  uVar1 = *ptr;
  bVar10 = uVar1 - 6;
  lVar17 = 1L << (bVar10 & 0x3f);
  pVStack_40 = this;
  validateBufferLength(this,(2L << (bVar10 & 0x3f)) + 2,length,true);
  puVar5 = (ulong *)(ptr + 1);
  uVar4 = lVar17 - 1;
  if (uVar4 < 8) {
    switch(uVar1) {
    case '\x06':
      uVar18 = (ulong)(byte)*puVar5;
      break;
    case '\a':
      uVar18 = (ulong)*(ushort *)(ptr + 1);
      break;
    case '\b':
      uVar18 = (ulong)*(uint *)(ptr + 1);
      break;
    case '\t':
      uVar18 = *puVar5;
    }
  }
  else {
    uVar18 = 0;
  }
  if (length < uVar18) {
    pEVar9 = (Exception *)__cxa_allocate_exception(0x18);
    pcVar14 = "Array length is out of bounds";
    goto LAB_00104724;
  }
  if (uVar1 == '\t') {
    if (uVar4 < 8) {
      uVar15 = *(ulong *)(ptr + (uVar18 - lVar17));
    }
    else {
      uVar15 = 0;
    }
    if (uVar15 == 0) goto LAB_0010475d;
    pVVar16 = (Validator *)((long)(ptr + (uVar18 - lVar17)) - (uVar15 << (bVar10 & 0x3f)));
    if ((pVVar16 < (Validator *)(ptr + lVar17)) ||
       ((Validator *)(ptr + lVar17 * -2 + length) < pVVar16)) goto LAB_00104773;
    pVVar6 = (Validator *)((long)puVar5 + lVar17);
    goto LAB_001045f7;
  }
  puVar5 = (ulong *)((long)puVar5 + lVar17);
  switch(uVar4) {
  case 0:
    uVar15 = (ulong)(byte)*puVar5;
    break;
  case 1:
    uVar15 = (ulong)(ushort)*puVar5;
    break;
  case 2:
    uVar8 = (ulong)((uint)*(byte *)((long)puVar5 + 1) << 8 |
                   (uint)*(byte *)((long)puVar5 + 2) << 0x10);
    uVar15 = (ulong)(byte)*puVar5;
    goto LAB_00104510;
  case 3:
    uVar15 = (ulong)(uint)*puVar5;
    break;
  case 4:
    uVar2 = (uint)*puVar5;
    uVar15 = (ulong)*(byte *)((long)puVar5 + 4);
    goto LAB_001044d3;
  case 5:
    uVar2 = (uint)*puVar5;
    uVar15 = (ulong)*(ushort *)((long)puVar5 + 4);
LAB_001044d3:
    uVar15 = uVar15 << 0x20 | (ulong)uVar2;
    break;
  case 6:
    uVar8 = (ulong)*(uint3 *)((long)puVar5 + 4) << 0x20;
    uVar15 = (ulong)(uint)*puVar5;
LAB_00104510:
    uVar15 = uVar15 | uVar8;
    break;
  case 7:
    uVar15 = *puVar5;
    break;
  default:
    uVar15 = 0;
  }
  if (uVar15 == 0) {
LAB_0010475d:
    pEVar9 = (Exception *)__cxa_allocate_exception(0x18);
    pcVar14 = "Array nrItems value is invalid";
  }
  else {
    pVVar7 = (Validator *)((long)puVar5 + lVar17);
    pVVar11 = (Validator *)((long)&pVVar7->_nesting + (-2L << (bVar10 & 0x3f)));
    pVVar16 = (Validator *)(ptr + uVar18);
    pVVar6 = pVVar7;
    pVVar12 = pVVar11;
    if (pVVar16 < pVVar11) {
      pVVar12 = pVVar16;
    }
    for (; (pVVar6 < pVVar12 && (*(byte *)&pVVar6->options == 0));
        pVVar6 = (Validator *)((long)&pVVar6->options + 1)) {
    }
    if (pVVar6 == pVVar11 || pVVar6 == pVVar7) {
      pVVar16 = (Validator *)((long)pVVar16 - (uVar15 << (bVar10 & 0x3f)));
      if (((pVVar16 < (Validator *)(ptr + lVar17 * 2)) || (pVVar16 < pVVar6)) ||
         ((Validator *)(ptr + (length - lVar17)) < pVVar16)) {
LAB_00104773:
        pEVar9 = (Exception *)__cxa_allocate_exception(0x18);
        pcVar14 = "Array index table is out of bounds";
      }
      else {
LAB_001045f7:
        uVar18 = 0;
        for (; pVVar6 < pVVar16; pVVar6 = (Validator *)((long)&pVVar6->options + uVar8)) {
          validatePart(pVStack_40,(uint8_t *)pVVar6,(long)pVVar16 - (long)pVVar6,true);
          lVar17 = uVar18 << (bVar10 & 0x3f);
          switch(uVar4) {
          case 0:
            uVar8 = (ulong)*(byte *)((long)&pVVar16->options + lVar17);
            break;
          case 1:
            uVar8 = (ulong)*(ushort *)((long)&pVVar16->options + lVar17);
            break;
          case 2:
            uVar13 = (ulong)((uint)*(byte *)((long)&pVVar16->options + lVar17 + 1) << 8 |
                            (uint)*(byte *)((long)&pVVar16->options + lVar17 + 2) << 0x10);
            uVar8 = (ulong)*(byte *)((long)&pVVar16->options + lVar17);
            goto LAB_001046ae;
          case 3:
            uVar8 = (ulong)*(uint *)((long)&pVVar16->options + lVar17);
            break;
          case 4:
            uVar2 = *(uint *)((long)&pVVar16->options + lVar17);
            uVar8 = (ulong)*(byte *)((long)&pVVar16->options + lVar17 + 4);
            goto LAB_0010468c;
          case 5:
            uVar2 = *(uint *)((long)&pVVar16->options + lVar17);
            uVar8 = (ulong)*(ushort *)((long)&pVVar16->options + lVar17 + 4);
LAB_0010468c:
            uVar8 = uVar8 << 0x20 | (ulong)uVar2;
            break;
          case 6:
            uVar13 = (ulong)CONCAT12(*(byte *)((long)&pVVar16->options + lVar17 + 6),
                                     *(undefined2 *)((long)&pVVar16->options + lVar17 + 4)) << 0x20;
            uVar8 = (ulong)*(uint *)((long)&pVVar16->options + lVar17);
LAB_001046ae:
            uVar8 = uVar8 | uVar13;
            break;
          case 7:
            uVar8 = *(ulong *)((long)&pVVar16->options + lVar17);
            break;
          default:
            uVar8 = 0;
          }
          if (uVar8 != (long)pVVar6 - (long)ptr) {
            pEVar9 = (Exception *)__cxa_allocate_exception(0x18);
            pcVar14 = "Array index table is wrong";
            goto LAB_00104724;
          }
          uVar8 = (ulong)"\x01\x01"[*(byte *)&pVVar6->options];
          pVStack_38 = pVVar6;
          if (uVar8 == 0) {
            uVar8 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
                    byteSizeDynamic((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
                                     *)&pVStack_38,(uint8_t *)pVVar6);
          }
          uVar18 = uVar18 + 1;
        }
        if (uVar18 == uVar15) {
          return;
        }
        pEVar9 = (Exception *)__cxa_allocate_exception(0x18);
        pcVar14 = "Array has more items than in index";
      }
    }
    else {
      pEVar9 = (Exception *)__cxa_allocate_exception(0x18);
      pcVar14 = "Array padding is invalid";
    }
  }
LAB_00104724:
  Exception::Exception(pEVar9,ValidatorInvalidLength,pcVar14);
  __cxa_throw(pEVar9,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void Validator::validateArray(uint8_t const* ptr, std::size_t length) {
  uint8_t head = *ptr;

  if (head == 0x13U) {
    // compact array
    validateCompactArray(ptr, length);
  } else if (head >= 0x02U && head <= 0x05U) {
    // array without index table
    validateUnindexedArray(ptr, length);
  } else if (head >= 0x06U && head <= 0x09U) {
    // array with index table
    validateIndexedArray(ptr, length);
  } else if (head == 0x01U) {
    // empty array. always valid
  }
}